

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

void llama_kv_cache_view_free(llama_kv_cache_view *view)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    free(*(void **)(in_RDI + 0x18));
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    free(*(void **)(in_RDI + 0x20));
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  return;
}

Assistant:

void llama_kv_cache_view_free(llama_kv_cache_view * view) {
    if (view->cells != nullptr) {
        free(view->cells);
        view->cells = nullptr;
    }
    if (view->cells_sequences != nullptr) {
        free(view->cells_sequences);
        view->cells_sequences = nullptr;
    }
}